

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,QList<int> *path)

{
  int iVar1;
  QDockAreaLayoutInfo *pQVar2;
  int *piVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  int index;
  QDockAreaLayoutInfo *info;
  QList<int> *in_stack_ffffffffffffffa8;
  QDockAreaLayout *in_stack_ffffffffffffffb0;
  QRect in_stack_ffffffffffffffe8;
  QDockAreaLayoutInfo *this_00;
  
  this_00 = *(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
  pQVar2 = QDockAreaLayout::info(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (pQVar2 == (QDockAreaLayoutInfo *)0x0) {
    QRect::QRect((QRect *)in_stack_ffffffffffffffb0);
  }
  else {
    piVar3 = QList<int>::last(in_stack_ffffffffffffffa8);
    iVar1 = *piVar3;
    if (-1 < iVar1) {
      qVar4 = QList<QDockAreaLayoutItem>::size(&pQVar2->item_list);
      if (iVar1 < qVar4) {
        in_stack_ffffffffffffffe8 =
             QDockAreaLayoutInfo::itemRect
                       (this_00,in_stack_ffffffffffffffe8.y2.m_i.m_i,
                        in_stack_ffffffffffffffe8.x2.m_i._3_1_);
        goto LAB_0057cd6d;
      }
    }
    QRect::QRect((QRect *)in_stack_ffffffffffffffb0);
  }
LAB_0057cd6d:
  if (*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28) == this_00) {
    return in_stack_ffffffffffffffe8;
  }
  __stack_chk_fail();
}

Assistant:

QRect QDockAreaLayout::gapRect(const QList<int> &path) const
{
    const QDockAreaLayoutInfo *info = this->info(path);
    if (info == nullptr)
        return QRect();
    int index = path.last();
    if (index < 0 || index >= info->item_list.size())
        return QRect();
    return info->itemRect(index, true);
}